

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testrunner.cpp
# Opt level: O0

bool compareSR(Result *r1,Result *r2)

{
  InstrInfo IVar1;
  Instr local_30;
  Instr instr;
  Result *r2_local;
  Result *r1_local;
  
  if (r1->opcode == r2->opcode) {
    IVar1 = moira::Moira::getInstrInfo(&moiracpu->super_Moira,r1->opcode);
    local_30 = IVar1.I;
    if ((local_30 == DIVU) || (local_30 == DIVS)) {
      r1_local._7_1_ = true;
    }
    else {
      r1_local._7_1_ = r1->sr == r2->sr;
    }
    return r1_local._7_1_;
  }
  __assert_fail("r1.opcode == r2.opcode",
                "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Runner/Testrunner.cpp"
                ,0x2fd,"bool compareSR(Result &, Result &)");
}

Assistant:

bool compareSR(Result &r1, Result &r2)
{
    assert(r1.opcode == r2.opcode);
    moira::Instr instr = moiracpu->getInstrInfo(r1.opcode).I;
    if (instr == Instr::DIVU || instr == Instr::DIVS) {

        // Musashi differs (and is likely wrong). Ignore it
        return true;
    }

    return r1.sr == r2.sr;
}